

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int socket_server_udp_connect(socket_server *ss,int id,char *addr,int port)

{
  int iVar1;
  int local_284;
  int addrsz;
  int protocol;
  request_package request;
  char portstr [16];
  addrinfo *ai_list;
  addrinfo ai_hints;
  int status;
  int port_local;
  char *addr_local;
  int id_local;
  socket_server *ss_local;
  
  portstr[8] = '\0';
  portstr[9] = '\0';
  portstr[10] = '\0';
  portstr[0xb] = '\0';
  portstr[0xc] = '\0';
  portstr[0xd] = '\0';
  portstr[0xe] = '\0';
  portstr[0xf] = '\0';
  ai_hints.ai_next._4_4_ = port;
  sprintf((char *)(request.dummy + 0xf8),"%d",(ulong)(uint)port);
  memset(&ai_list,0,0x30);
  ai_list._4_4_ = 0;
  ai_hints.ai_flags = 2;
  ai_hints.ai_family = 0x11;
  ai_hints.ai_next._0_4_ =
       getaddrinfo(addr,(char *)(request.dummy + 0xf8),(addrinfo *)&ai_list,
                   (addrinfo **)(portstr + 8));
  if ((int)ai_hints.ai_next == 0) {
    request.header._0_4_ = id;
    if (*(int *)(portstr._8_8_ + 4) == 2) {
      local_284 = 1;
    }
    else {
      if (*(int *)(portstr._8_8_ + 4) != 10) {
        freeaddrinfo((addrinfo *)portstr._8_8_);
        return -1;
      }
      local_284 = 2;
    }
    iVar1 = gen_udp_address(local_284,*(sockaddr_all **)(portstr._8_8_ + 0x18),request.header + 4);
    freeaddrinfo((addrinfo *)portstr._8_8_);
    send_request(ss,(request_package *)&addrsz,'C',iVar1 + 5);
    ss_local._4_4_ = 0;
  }
  else {
    ss_local._4_4_ = -1;
  }
  return ss_local._4_4_;
}

Assistant:

int
socket_server_udp_connect(struct socket_server *ss, int id, const char * addr, int port) {
	int status;
	struct addrinfo ai_hints;
	struct addrinfo *ai_list = NULL;
	char portstr[16];
	sprintf(portstr, "%d", port);
	memset( &ai_hints, 0, sizeof( ai_hints ) );
	ai_hints.ai_family = AF_UNSPEC;
	ai_hints.ai_socktype = SOCK_DGRAM;
	ai_hints.ai_protocol = IPPROTO_UDP;

	status = getaddrinfo(addr, portstr, &ai_hints, &ai_list );
	if ( status != 0 ) {
		return -1;
	}
	struct request_package request;
	request.u.set_udp.id = id;
	int protocol;

	if (ai_list->ai_family == AF_INET) {
		protocol = PROTOCOL_UDP;
	} else if (ai_list->ai_family == AF_INET6) {
		protocol = PROTOCOL_UDPv6;
	} else {
		freeaddrinfo( ai_list );
		return -1;
	}

	int addrsz = gen_udp_address(protocol, (union sockaddr_all *)ai_list->ai_addr, request.u.set_udp.address);

	freeaddrinfo( ai_list );

	send_request(ss, &request, 'C', sizeof(request.u.set_udp) - sizeof(request.u.set_udp.address) +addrsz);

	return 0;
}